

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 auVar3 [16];
  string_view sVar4;
  undefined1 local_58 [8];
  string filename;
  char *module_type;
  char *extension;
  ScriptModule *module_local;
  BinaryWriterSpec *this_local;
  string_view text_local;
  
  module_type = "";
  filename.field_2._8_8_ = (long)"\n\n" + 2;
  SVar1 = ScriptModule::type(module);
  if (SVar1 == Text) {
    module_type = kWasmExtension;
    filename.field_2._8_8_ = anon_var_dwarf_c9d14;
  }
  else if (SVar1 == Binary) {
    module_type = kWasmExtension;
    filename.field_2._8_8_ = anon_var_dwarf_c9d14;
  }
  else if (SVar1 == Quoted) {
    module_type = kWatExtension;
    filename.field_2._8_8_ = anon_var_dwarf_c1540;
  }
  iVar2 = (*module->_vptr_ScriptModule[2])();
  WriteLocation(this,(Location *)CONCAT44(extraout_var,iVar2));
  WriteSeparator(this);
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
            ((string *)local_58,this,module_type);
  WriteKey(this,"filename");
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  sVar4._M_str = auVar3._8_8_;
  sVar4._M_len = (size_t)sVar4._M_str;
  sVar4 = GetBasename(auVar3._0_8_,sVar4);
  WriteEscapedString(this,sVar4);
  WriteSeparator(this);
  WriteKey(this,"text");
  WriteEscapedString(this,text);
  WriteSeparator(this);
  WriteKey(this,"module_type");
  WriteString(this,(char *)filename.field_2._8_8_);
  sVar4 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  WriteScriptModule(this,sVar4,module);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          std::string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}